

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_ueg(bitstream *str,h264_cabac_context *cabac,int *ctxIdx,int numidx,int k,int sign,
                  uint32_t uCoff,int32_t *val)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint32_t tmp;
  uint32_t local_3c;
  int local_38;
  uint local_34;
  
  uVar2 = *val;
  local_34 = -uVar2;
  if (0 < (int)uVar2) {
    local_34 = uVar2;
  }
  if (uCoff <= local_34) {
    local_34 = uCoff;
  }
  iVar1 = h264_cabac_tu(str,cabac,ctxIdx,numidx,uCoff,&local_34);
  uVar2 = local_34;
  if (iVar1 != 0) {
    return 1;
  }
  local_38 = sign;
  if (local_34 < uCoff) goto LAB_00109328;
  if (str->dir == VS_ENCODE) {
    uVar4 = *val;
    uVar2 = -uVar4;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
    uVar4 = uVar2 - uCoff;
    local_3c = 1;
    for (; uVar3 = 1 << ((byte)k & 0x1f), uVar3 <= uVar4; k = k + 1) {
      iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
      if (iVar1 != 0) {
        return 1;
      }
      uVar4 = uVar4 - uVar3;
    }
    local_3c = 0;
    iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
    if (iVar1 != 0) {
      return 1;
    }
    while (k = k - 1, k != 0xffffffff) {
      local_3c = (uint32_t)((uVar4 >> (k & 0x1fU) & 1) != 0);
      iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
      if (iVar1 != 0) {
        return 1;
      }
    }
    goto LAB_00109328;
  }
  iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
  if (iVar1 == 0) {
    do {
      if (local_3c == 0) {
        bVar5 = true;
        if (k == 0) goto LAB_0010931f;
        goto LAB_0010942b;
      }
      uVar2 = uVar2 + (1 << ((byte)k & 0x1f));
      k = k + 1;
      iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
    } while (iVar1 == 0);
  }
  bVar5 = false;
  goto LAB_0010931f;
  while (uVar2 = uVar2 + (local_3c << ((byte)k & 0x1f)), k != 0) {
LAB_0010942b:
    k = k + -1;
    iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
    bVar5 = iVar1 == 0;
    if (!bVar5) break;
  }
LAB_0010931f:
  if (!bVar5) {
    return 1;
  }
LAB_00109328:
  if ((local_38 != 0) && (uVar2 != 0)) {
    local_3c = (uint)*val >> 0x1f;
    iVar1 = h264_cabac_bypass(str,cabac,&local_3c);
    if (iVar1 != 0) {
      return 1;
    }
    if (str->dir == VS_DECODE) {
      uVar4 = -uVar2;
      if (local_3c == 0) {
        uVar4 = uVar2;
      }
      *val = uVar4;
    }
    return 0;
  }
  if (str->dir == VS_DECODE) {
    *val = uVar2;
    return 0;
  }
  return 0;
}

Assistant:

int h264_cabac_ueg(struct bitstream *str, struct h264_cabac_context *cabac, int *ctxIdx, int numidx, int k, int sign, uint32_t uCoff, int32_t *val) {
	uint32_t tuval = abs(*val);
	if (tuval > uCoff)
		tuval = uCoff;
	if (h264_cabac_tu(str, cabac, ctxIdx, numidx, uCoff, &tuval)) return 1;
	uint32_t rval = tuval;
	if (tuval >= uCoff) {
		if (str->dir == VS_ENCODE) {
			rval = abs(*val);
			uint32_t sufS = rval - uCoff;
			uint32_t tmp = 1;
			while (sufS >= (1 << k)) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				sufS -= 1 << k;
				k++;
			}
			tmp = 0;
			if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			while (k--) {
				tmp = sufS >> k & 1;
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
			}
		} else {
			uint32_t tmp;
			while (1) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				if (!tmp)
					break;
				rval += 1 << k;
				k++;
			}
			while (k--) {
				if (h264_cabac_bypass(str, cabac, &tmp)) return 1;
				rval += tmp << k;
			}
		}
	}
	if (rval && sign) {
		uint32_t s = *val < 0;
		if (h264_cabac_bypass(str, cabac, &s)) return 1;
		if (str->dir == VS_DECODE) {
			if (s)
				*val = -rval;
			else
				*val = rval;
		}
	} else {
		if (str->dir == VS_DECODE)
			*val = rval;
	}
	return 0;
}